

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O3

ArgIface * __thiscall Args::Arg::findArgument(Arg *this,String *name)

{
  int iVar1;
  bool bVar2;
  QByteArrayView QVar3;
  QStringView QVar4;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  String local_58;
  QArrayData *local_38;
  storage_type_conflict *psStack_30;
  long local_28;
  
  QVar3.m_data = (storage_type *)0x2;
  QVar3.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar3);
  local_38 = &(local_58.m_str.d.d)->super_QArrayData;
  psStack_30 = local_58.m_str.d.ptr;
  local_28 = local_58.m_str.d.size;
  iVar1 = QString::indexOf(&name->m_str,(longlong)&local_38,CaseInsensitive);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  if (iVar1 == 0) {
    String::substr(&local_58,name,2,-1);
    if (local_58.m_str.d.size == (this->m_name).m_str.d.size) {
      QVar4.m_data = local_58.m_str.d.ptr;
      QVar4.m_size = local_58.m_str.d.size;
      QVar6.m_data = (this->m_name).m_str.d.ptr;
      QVar6.m_size = local_58.m_str.d.size;
      iVar1 = QtPrivate::compareStrings(QVar4,QVar6,CaseSensitive);
      bVar2 = iVar1 == 0;
    }
    else {
      bVar2 = false;
    }
    if (&(local_58.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_58.m_str.d.d)->super_QArrayData,2,8);
      }
    }
    if (bVar2) {
      return &this->super_ArgIface;
    }
  }
  bVar2 = details::isFlag(name);
  if (bVar2) {
    String::substr(&local_58,name,1,-1);
    if (local_58.m_str.d.size == (this->m_flag).m_str.d.size) {
      QVar5.m_data = local_58.m_str.d.ptr;
      QVar5.m_size = local_58.m_str.d.size;
      QVar7.m_data = (this->m_flag).m_str.d.ptr;
      QVar7.m_size = local_58.m_str.d.size;
      iVar1 = QtPrivate::compareStrings(QVar5,QVar7,CaseSensitive);
      if (iVar1 != 0) {
        this = (Arg *)0x0;
      }
    }
    else {
      this = (Arg *)0x0;
    }
    if (&(local_58.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_58.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_58.m_str.d.d)->super_QArrayData,2,8);
      }
    }
  }
  else {
    this = (Arg *)0x0;
  }
  return &this->super_ArgIface;
}

Assistant:

ArgIface * findArgument(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & name ) override
	{
		if( details::isArgument( name ) && name.substr( 2 ) == m_name )
			return this;
		else if( details::isFlag( name ) && name.substr( 1 ) == m_flag )
			return this;
		else
			return nullptr;
	}